

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc_manager_direct.cc
# Opt level: O2

void __thiscall webrtc::AgcManagerDirect::UpdateGain(AgcManagerDirect *this)

{
  int *piVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  int *piVar7;
  uint new_level;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int rms_error;
  LogMessage local_1b0;
  
  cVar2 = (**(code **)((long)((this->agc_)._M_t.
                              super___uniq_ptr_impl<webrtc::Agc,_std::default_delete<webrtc::Agc>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_webrtc::Agc_*,_std::default_delete<webrtc::Agc>_>
                              .super__Head_base<0UL,_webrtc::Agc_*,_false>._M_head_impl)->_vptr_Agc
                      + 0x20))();
  if (cVar2 != '\0') {
    iVar5 = this->max_compression_gain_;
    iVar10 = this->target_compression_;
    iVar4 = 2;
    if (iVar5 < 2) {
      iVar4 = iVar5;
    }
    iVar9 = 2;
    if (2 < iVar4) {
      iVar9 = iVar4;
    }
    if ((iVar5 + -1 == iVar10 && iVar9 == iVar5) || (iVar10 == 3 && iVar4 < 3)) {
      this->target_compression_ = iVar9;
    }
    else {
      this->target_compression_ = (iVar9 - iVar10) / 2 + iVar10;
    }
    iVar10 = 2 - iVar9;
    iVar5 = -0xf;
    if (-0xf < iVar10) {
      iVar5 = iVar10;
    }
    iVar4 = 0xf;
    if (iVar5 < 0xf) {
      iVar4 = iVar5;
    }
    bVar3 = LogMessage::Loggable(LS_INFO);
    if (bVar3) {
      LogMessage::LogMessage
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/agc/agc_manager_direct.cc"
                 ,400,LS_INFO);
      poVar6 = std::operator<<((ostream *)&local_1b0,"[agc] rms_error=");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,2);
      poVar6 = std::operator<<(poVar6,", ");
      poVar6 = std::operator<<(poVar6,"target_compression=");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->target_compression_);
      poVar6 = std::operator<<(poVar6,", ");
      poVar6 = std::operator<<(poVar6,"residual_gain=");
      std::ostream::operator<<(poVar6,iVar4);
      LogMessage::~LogMessage(&local_1b0);
    }
    if (iVar9 != 2) {
      uVar8 = (ulong)(uint)this->level_;
      if (0xff < uVar8) {
        __assert_fail("level >= 0 && level <= kMaxMicLevel",
                      "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/agc/agc_manager_direct.cc"
                      ,0x40,"int webrtc::(anonymous namespace)::LevelFromGainError(int, int)");
      }
      piVar1 = kGainMap + uVar8;
      if (iVar10 < 1) {
        do {
          new_level = (uint)uVar8;
          if (new_level < 0xd) break;
          piVar7 = kGainMap + uVar8;
          uVar8 = (ulong)(new_level - 1);
        } while (iVar4 < *piVar7 - *piVar1);
      }
      else {
        piVar7 = kGainMap + uVar8;
        do {
          new_level = (uint)uVar8;
          uVar8 = (ulong)(new_level + 1);
          if (0xfe < (int)new_level) break;
          iVar5 = *piVar7;
          piVar7 = piVar7 + 1;
        } while (iVar5 - *piVar1 < iVar4);
      }
      SetLevel(this,new_level);
    }
  }
  return;
}

Assistant:

void AgcManagerDirect::UpdateGain() {
  int rms_error = 0;
  if (!agc_->GetRmsErrorDb(&rms_error)) {
    // No error update ready.
    return;
  }
  // The compressor will always add at least kMinCompressionGain. In effect,
  // this adjusts our target gain upward by the same amount and rms_error
  // needs to reflect that.
  rms_error += kMinCompressionGain;

  // Handle as much error as possible with the compressor first.
  int raw_compression = std::max(std::min(rms_error, max_compression_gain_),
                                 kMinCompressionGain);
  // Deemphasize the compression gain error. Move halfway between the current
  // target and the newly received target. This serves to soften perceptible
  // intra-talkspurt adjustments, at the cost of some adaptation speed.
  if ((raw_compression == max_compression_gain_ &&
      target_compression_ == max_compression_gain_ - 1) ||
      (raw_compression == kMinCompressionGain &&
      target_compression_ == kMinCompressionGain + 1)) {
    // Special case to allow the target to reach the endpoints of the
    // compression range. The deemphasis would otherwise halt it at 1 dB shy.
    target_compression_ = raw_compression;
  } else {
    target_compression_ = (raw_compression - target_compression_) / 2
        + target_compression_;
  }

  // Residual error will be handled by adjusting the volume slider. Use the
  // raw rather than deemphasized compression here as we would otherwise
  // shrink the amount of slack the compressor provides.
  int residual_gain = rms_error - raw_compression;
  residual_gain = std::min(std::max(residual_gain, -kMaxResidualGainChange),
      kMaxResidualGainChange);
  LOG(LS_INFO) << "[agc] rms_error=" << rms_error << ", "
               << "target_compression=" << target_compression_ << ", "
               << "residual_gain=" << residual_gain;
  if (residual_gain == 0)
    return;

  SetLevel(LevelFromGainError(residual_gain, level_));
}